

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalValue.h
# Opt level: O2

bool * __thiscall jbcoin::LocalValue<bool>::operator*(LocalValue<bool> *this)

{
  thread_specific_ptr<jbcoin::detail::LocalValues> *ptVar1;
  LocalValues *new_value;
  iterator iVar2;
  bool *pbVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false,_false>,_bool>
  pVar4;
  long *local_30;
  LocalValue<bool> *local_28;
  
  ptVar1 = detail::getLocalValues<void>();
  new_value = (LocalValues *)boost::detail::get_tss_data(ptVar1);
  if (new_value == (LocalValues *)0x0) {
    new_value = (LocalValues *)operator_new(0x40);
    *(undefined8 *)new_value = 0;
    (new_value->values)._M_h._M_buckets = (__buckets_ptr)0x0;
    (new_value->values)._M_h._M_bucket_count = 0;
    (new_value->values)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (new_value->values)._M_h._M_element_count = 0;
    *(undefined8 *)&(new_value->values)._M_h._M_rehash_policy = 0;
    (new_value->values)._M_h._M_buckets = &(new_value->values)._M_h._M_single_bucket;
    (new_value->values)._M_h._M_bucket_count = 1;
    (new_value->values)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (new_value->values)._M_h._M_element_count = 0;
    (new_value->values)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (new_value->values)._M_h._M_rehash_policy._M_next_resize = 0;
    (new_value->values)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    new_value->onCoro = false;
    ptVar1 = detail::getLocalValues<void>();
    boost::thread_specific_ptr<jbcoin::detail::LocalValues>::reset(ptVar1,new_value);
  }
  else {
    local_28 = this;
    iVar2 = std::
            _Hashtable<const_void_*,_std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_std::allocator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(new_value->values)._M_h,&local_28);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pbVar3 = (bool *)(**(code **)(**(long **)((long)iVar2.
                                                  super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
                                                  ._M_cur + 0x10) + 0x10))();
      return pbVar3;
    }
  }
  local_28 = this;
  std::make_unique<jbcoin::detail::LocalValues::Value<bool>,bool&>((bool *)&local_30);
  pVar4 = std::
          _Hashtable<void_const*,std::pair<void_const*const,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>>,std::allocator<std::pair<void_const*const,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<jbcoin::LocalValue<bool>*,std::unique_ptr<jbcoin::detail::LocalValues::Value<bool>,std::default_delete<jbcoin::detail::LocalValues::Value<bool>>>>
                    ((_Hashtable<void_const*,std::pair<void_const*const,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>>,std::allocator<std::pair<void_const*const,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&new_value->values,&local_28,&local_30);
  pbVar3 = (bool *)(**(code **)(**(long **)((long)pVar4.first.
                                                  super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
                                                  ._M_cur.
                                                  super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
                                           + 0x10) + 0x10))();
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  return pbVar3;
}

Assistant:

T&
LocalValue<T>::operator*()
{
    auto lvs = detail::getLocalValues().get();
    if (! lvs)
    {
        lvs = new detail::LocalValues();
        lvs->onCoro = false;
        detail::getLocalValues().reset(lvs);
    }
    else
    {
        auto const iter = lvs->values.find(this);
        if (iter != lvs->values.end())
            return *reinterpret_cast<T*>(iter->second->get());
    }

    return *reinterpret_cast<T*>(lvs->values.emplace(this,
        std::make_unique<detail::LocalValues::Value<T>>(t_)).
            first->second->get());
}